

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int aec_buffer_encode(aec_stream *strm)

{
  int iVar1;
  
  iVar1 = aec_encode_init(strm);
  if (iVar1 != 0) {
    return iVar1;
  }
  aec_encode(strm,1);
  iVar1 = aec_encode_end(strm);
  return iVar1;
}

Assistant:

int aec_buffer_encode(struct aec_stream *strm)
{
    int status = aec_encode_init(strm);
    if (status != AEC_OK)
        return status;
    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        cleanup(strm);
        return status;
    }
    return aec_encode_end(strm);
}